

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.hh
# Opt level: O1

void __thiscall molly::MollyError::~MollyError(MollyError *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__MollyError_00105d78;
  pcVar1 = (this->_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_message).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  operator_delete(this);
  return;
}

Assistant:

MollyError(std::string message)
    : _message(message)
    {}